

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::TraverseSchema::traverseKey
          (TraverseSchema *this,DOMElement *icElem,SchemaElementDecl *elemDecl)

{
  bool bVar1;
  XMLCh *src;
  XMLSize_t count;
  RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *this_00;
  IC_Key *this_01;
  XMLCh *elemName;
  Janitor<xercesc_4_0::IC_Key> local_60;
  Janitor<xercesc_4_0::IC_Key> janKey;
  IC_Key *icKey;
  XMLCh *name;
  undefined1 local_30 [8];
  NamespaceScopeManager nsMgr;
  SchemaElementDecl *elemDecl_local;
  DOMElement *icElem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)elemDecl;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)local_30,icElem,this->fSchemaInfo,this);
  GeneralAttributeCheck::checkAttributes
            (&this->fAttributeCheck,icElem,0x1a,this,false,this->fNonXSAttList);
  src = getElementAttValue(this,icElem,(XMLCh *)SchemaSymbols::fgATT_NAME,NCName);
  count = XMLString::stringLen(src);
  bVar1 = XMLChar1_0::isValidNCName(src,count);
  if (bVar1) {
    if (this->fIdentityConstraintNames ==
        (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)0x0) {
      this_00 = (RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x30,this->fMemoryManager);
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
      RefHash2KeysTableOf(this_00,0x1d,false,this->fMemoryManager);
      this->fIdentityConstraintNames = this_00;
    }
    else {
      bVar1 = RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::
              containsKey(this->fIdentityConstraintNames,src,this->fTargetNSURI);
      if (bVar1) {
        reportSchemaError(this,icElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x82,src,(XMLCh *)0x0,
                          (XMLCh *)0x0,(XMLCh *)0x0);
        goto LAB_0043cd65;
      }
    }
    this_01 = (IC_Key *)XMemory::operator_new(0x38,this->fGrammarPoolMemoryManager);
    elemName = XMLElementDecl::getBaseName((XMLElementDecl *)nsMgr.fSchemaInfo);
    IC_Key::IC_Key(this_01,src,elemName,this->fGrammarPoolMemoryManager);
    janKey.fData = this_01;
    Janitor<xercesc_4_0::IC_Key>::Janitor(&local_60,this_01);
    RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
              (this->fIdentityConstraintNames,src,this->fTargetNSURI,
               &(janKey.fData)->super_IdentityConstraint);
    bVar1 = traverseIdentityConstraint(this,&(janKey.fData)->super_IdentityConstraint,icElem);
    if (bVar1) {
      SchemaElementDecl::addIdentityConstraint
                ((SchemaElementDecl *)nsMgr.fSchemaInfo,&(janKey.fData)->super_IdentityConstraint);
      IdentityConstraint::setNamespaceURI
                (&(janKey.fData)->super_IdentityConstraint,this->fTargetNSURI);
      Janitor<xercesc_4_0::IC_Key>::orphan(&local_60);
    }
    else {
      RefHash2KeysTableOf<xercesc_4_0::IdentityConstraint,_xercesc_4_0::StringHasher>::put
                (this->fIdentityConstraintNames,src,this->fTargetNSURI,(IdentityConstraint *)0x0);
    }
    Janitor<xercesc_4_0::IC_Key>::~Janitor(&local_60);
  }
  else {
    reportSchemaError(this,icElem,(XMLCh *)XMLUni::fgXMLErrDomain,0x35,L"key",src,(XMLCh *)0x0,
                      (XMLCh *)0x0);
  }
LAB_0043cd65:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)local_30);
  return;
}

Assistant:

void TraverseSchema::traverseKey(const DOMElement* const icElem,
                                 SchemaElementDecl* const elemDecl) {

    NamespaceScopeManager nsMgr(icElem, fSchemaInfo, this);

    // -----------------------------------------------------------------------
    // Check Attributes
    // -----------------------------------------------------------------------
    fAttributeCheck.checkAttributes(
        icElem, GeneralAttributeCheck::E_Key, this, false, fNonXSAttList
    );

    // -----------------------------------------------------------------------
    // Create identity constraint
    // -----------------------------------------------------------------------
    const XMLCh* name = getElementAttValue(icElem, SchemaSymbols::fgATT_NAME, DatatypeValidator::NCName);

    if (!XMLChar1_0::isValidNCName(name, XMLString::stringLen(name))) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidDeclarationName,
                          SchemaSymbols::fgELT_KEY, name);
        return;
    }


    if (!fIdentityConstraintNames) {
        fIdentityConstraintNames = new (fMemoryManager) RefHash2KeysTableOf<IdentityConstraint>(29, (bool) false, fMemoryManager);
    }
    else if (fIdentityConstraintNames->containsKey(name, fTargetNSURI)) {
        reportSchemaError(icElem, XMLUni::fgXMLErrDomain, XMLErrs::IC_DuplicateDecl, name);
        return;
    }

    IC_Key* icKey = new (fGrammarPoolMemoryManager) IC_Key(name, elemDecl->getBaseName(), fGrammarPoolMemoryManager);
    Janitor<IC_Key> janKey(icKey);

    fIdentityConstraintNames->put((void*) name, fTargetNSURI, icKey);

    // -----------------------------------------------------------------------
    // Get selector and fields
    // -----------------------------------------------------------------------
    if (!traverseIdentityConstraint(icKey, icElem)) {

        fIdentityConstraintNames->put((void*) name, fTargetNSURI, 0);
        return;
    }

    // -----------------------------------------------------------------------
    // Add key to element declaration
    // -----------------------------------------------------------------------
    elemDecl->addIdentityConstraint(icKey);
    icKey->setNamespaceURI(fTargetNSURI);
    janKey.orphan();
}